

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<RCCFileInfo*>::
appendIteratorRange<QMultiHash<QString,RCCFileInfo*>::const_iterator>
          (QCommonArrayOps<RCCFileInfo_*> *this,const_iterator b,const_iterator e,
          IfIsForwardIterator<QMultiHash<QString,_RCCFileInfo_*>::const_iterator> param_4)

{
  const_iterator __first;
  const_iterator __last;
  bool bVar1;
  RCCFileInfo **ppRVar2;
  long in_RDI;
  long in_FS_OFFSET;
  undefined8 unaff_retaddr;
  Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_> *in_stack_00000008;
  QArrayDataPointer<RCCFileInfo_*> *in_stack_00000010;
  Chain **in_stack_00000018;
  Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_> *in_stack_00000020;
  RCCFileInfo **iter;
  qsizetype distance;
  Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_> *this_00;
  RCCFileInfo **local_58;
  Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_> *pDVar3;
  
  pDVar3 = *(Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_> **)(in_FS_OFFSET + 0x28);
  __first.i.bucket = (size_t)in_stack_00000010;
  __first.i.d = in_stack_00000008;
  __first.e = in_stack_00000018;
  __last.e = (Chain **)in_stack_00000008;
  __last.i.bucket = unaff_retaddr;
  __last.i.d = pDVar3;
  std::distance<QMultiHash<QString,RCCFileInfo*>::const_iterator>(__first,__last);
  local_58 = QArrayDataPointer<RCCFileInfo_*>::end(in_stack_00000010);
  this_00 = in_stack_00000020;
  while( true ) {
    bVar1 = QMultiHash<QString,_RCCFileInfo_*>::const_iterator::operator!=
                      ((const_iterator *)&stack0x00000008,(const_iterator *)&stack0x00000020);
    if (!bVar1) break;
    ppRVar2 = QMultiHash<QString,_RCCFileInfo_*>::const_iterator::operator*
                        ((const_iterator *)&stack0x00000008);
    *local_58 = *ppRVar2;
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    local_58 = local_58 + 1;
    QMultiHash<QString,_RCCFileInfo_*>::const_iterator::operator++((const_iterator *)this_00);
  }
  if (*(Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_> **)(in_FS_OFFSET + 0x28) == pDVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }